

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O1

SQRESULT sq_compile(HSQUIRRELVM v,SQLEXREADFUNC read,SQUserPointer p,SQChar *sourcename,
                   SQBool raiseerror)

{
  SQUnsignedInteger *pSVar1;
  SQSharedState *ss;
  SQObjectValue func;
  bool bVar2;
  SQWeakRef *root;
  SQRESULT SVar3;
  SQObjectPtr o;
  SQObjectPtr local_38;
  SQObjectPtr local_28;
  
  local_28.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_28.super_SQObject._type = OT_NULL;
  bVar2 = Compile(v,read,p,sourcename,&local_28,raiseerror != 0,v->_sharedstate->_debuginfo);
  func = local_28.super_SQObject._unVal;
  SVar3 = -1;
  if (bVar2) {
    ss = v->_sharedstate;
    root = SQRefCounted::GetWeakRef((v->_roottable).super_SQObject._unVal.pRefCounted,OT_TABLE);
    local_38.super_SQObject._unVal.pClosure = SQClosure::Create(ss,func.pFunctionProto,root);
    local_38.super_SQObject._type = OT_CLOSURE;
    if ((SQClosure *)local_38.super_SQObject._unVal.pTable == (SQClosure *)0x0) {
      __assert_fail("_unVal.pTable",
                    "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/deps/squirrel/squirrel/sqobject.h"
                    ,0xe5,"SQObjectPtr::SQObjectPtr(SQClosure *)");
    }
    pSVar1 = &((local_38.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
    SQVM::Push(v,&local_38);
    SQObjectPtr::~SQObjectPtr(&local_38);
    SVar3 = 0;
  }
  SQObjectPtr::~SQObjectPtr(&local_28);
  return SVar3;
}

Assistant:

SQRESULT sq_compile(HSQUIRRELVM v,SQLEXREADFUNC read,SQUserPointer p,const SQChar *sourcename,SQBool raiseerror)
{
    SQObjectPtr o;
#ifndef NO_COMPILER
    if(Compile(v, read, p, sourcename, o, raiseerror?true:false, _ss(v)->_debuginfo)) {
        v->Push(SQClosure::Create(_ss(v), _funcproto(o), _table(v->_roottable)->GetWeakRef(OT_TABLE)));
        return SQ_OK;
    }
    return SQ_ERROR;
#else
    return sq_throwerror(v,_SC("this is a no compiler build"));
#endif
}